

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O2

int Ifn_NtkMatch(Ifn_Ntk_t *p,word *pTruth,int nVars,int nConfls,int fVerbose,int fVeryVerbose,
                word *pConfig)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  abctime aVar5;
  sat_solver *s;
  abctime aVar6;
  word *pOut;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  char *pcVar16;
  bool bVar17;
  
  iVar4 = 1;
  iVar2 = 1 << ((byte)nVars & 0x1f);
  aVar5 = Abc_Clock();
  if (nVars != 0) {
    s = sat_solver_new();
    Ifn_Prepare(p,pTruth,nVars);
    sat_solver_setnvars(s,p->nPars);
    Ifn_NtkAddConstraints(p,s);
    if (fVeryVerbose != 0) {
      aVar6 = Abc_Clock();
      Ifn_NtkMatchPrintStatus(s,0,1,-1,-1,aVar6 - aVar5);
    }
    if ((pConfig != (word *)0x0) && (*pConfig != 0)) {
      __assert_fail("*pConfig == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifTune.c"
                    ,0x541,"int Ifn_NtkMatch(Ifn_Ntk_t *, word *, int, int, int, int, word *)");
    }
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    uVar8 = 0;
    uVar11 = 0;
    while( true ) {
      iVar7 = (int)uVar8;
      if (iVar7 == iVar2) {
        __assert_fail("i < nIterMax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifTune.c"
                      ,0x56e,"int Ifn_NtkMatch(Ifn_Ntk_t *, word *, int, int, int, int, word *)");
      }
      uVar14 = p->nObjs;
      uVar9 = 0;
      if (0 < (int)uVar14) {
        uVar9 = (ulong)uVar14;
      }
      for (uVar10 = 0; uVar13 = (uint)uVar11, uVar9 != uVar10; uVar10 = uVar10 + 1) {
        uVar13 = (uint)((uVar13 >> ((uint)uVar10 & 0x1f) & 1) != 0);
        if ((long)p->nVars <= (long)uVar10) {
          uVar13 = 0xffffffff;
        }
        p->Values[uVar10] = uVar13;
      }
      p->Values[(long)(int)uVar14 + -1] =
           (uint)((pTruth[(int)uVar13 >> 6] >> (uVar11 & 0x3f) & 1) != 0);
      iVar3 = Ifn_NtkAddClauses(p,p->Values,s);
      iVar4 = 0;
      bVar17 = true;
      if (iVar3 == 0) break;
      iVar3 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,(long)nConfls,0,0,0);
      if (fVeryVerbose != 0) {
        iVar12 = p->Values[(long)p->nObjs + -1];
        aVar6 = Abc_Clock();
        Ifn_NtkMatchPrintStatus(s,iVar7 + 1,iVar3,uVar13,iVar12,aVar6 - aVar5);
      }
      if (iVar3 != 1) break;
      for (lVar15 = (long)p->nObjs; lVar15 < p->nPars; lVar15 = lVar15 + 1) {
        iVar4 = sat_solver_var_value(s,(int)lVar15);
        p->Values[lVar15] = iVar4;
      }
      pOut = Ifn_NtkDeriveTruth(p,p->Values);
      Abc_TtXor(pOut,pOut,p->pTruth,p->nWords,0);
      iVar4 = 1;
      bVar1 = (char)p->nVars - 6U & 0x1f;
      uVar14 = 1 << bVar1;
      if (1 << bVar1 < 1) {
        uVar14 = 0;
      }
      uVar11 = (ulong)uVar14;
      if (p->nVars < 7) {
        uVar11 = 1;
      }
      lVar15 = 0;
      while( true ) {
        if (uVar11 * 0x40 + lVar15 == 0) goto LAB_0039e270;
        uVar9 = *pOut;
        if (uVar9 != 0) break;
        lVar15 = lVar15 + -0x40;
        pOut = pOut + 1;
      }
      bVar17 = (int)uVar9 == 0;
      uVar11 = uVar9 >> 0x20;
      if (!bVar17) {
        uVar11 = uVar9;
      }
      iVar12 = (uint)bVar17 * 0x20;
      iVar3 = iVar12 + 0x10;
      uVar9 = uVar11 >> 0x10;
      if ((short)uVar11 != 0) {
        iVar3 = iVar12;
        uVar9 = uVar11;
      }
      iVar12 = iVar3 + 8;
      uVar11 = uVar9 >> 8;
      if ((char)uVar9 != '\0') {
        iVar12 = iVar3;
        uVar11 = uVar9;
      }
      iVar3 = iVar12 + 4;
      uVar9 = uVar11 >> 4;
      if ((uVar11 & 0xf) != 0) {
        iVar3 = iVar12;
        uVar9 = uVar11;
      }
      uVar14 = (uint)(uVar9 >> 2) & 0x3fffffff;
      iVar12 = iVar3 + 2;
      if ((uVar9 & 3) != 0) {
        uVar14 = (uint)uVar9;
        iVar12 = iVar3;
      }
      uVar14 = (~uVar14 & 1) + iVar12;
      if ((int)lVar15 - uVar14 == 1) {
LAB_0039e270:
        if (pConfig != (word *)0x0) {
          Ifn_NtkMatchCollectConfig(p,s,pConfig);
        }
        bVar17 = false;
        break;
      }
      uVar11 = (ulong)uVar14 - lVar15;
      uVar8 = (ulong)(iVar7 + 1);
    }
    if (fVerbose != 0) {
      pcVar16 = "yes";
      if (bVar17) {
        pcVar16 = "no ";
      }
      uVar14 = sat_solver_nconflicts(s);
      printf("%s  Iter =%4d. Confl = %6d.  ",pcVar16,uVar8,(ulong)uVar14);
      if (!bVar17) {
        Ifn_NtkMatchPrintConfig(p,s);
      }
      putchar(10);
    }
    sat_solver_delete(s);
  }
  return iVar4;
}

Assistant:

int Ifn_NtkMatch( Ifn_Ntk_t * p, word * pTruth, int nVars, int nConfls, int fVerbose, int fVeryVerbose, word * pConfig )
{
    word * pTruth1;
    int RetValue = 0;
    int nIterMax = (1<<nVars);
    int i, v, status, iMint = 0;
    abctime clk = Abc_Clock();
//    abctime clkTru = 0, clkSat = 0, clk2;
    sat_solver * pSat;
    if ( nVars == 0 )
        return 1;
    pSat = sat_solver_new();
    Ifn_Prepare( p, pTruth, nVars );
    sat_solver_setnvars( pSat, p->nPars );
    Ifn_NtkAddConstraints( p, pSat );
    if ( fVeryVerbose )
        Ifn_NtkMatchPrintStatus( pSat, 0, l_True, -1, -1, Abc_Clock() - clk );
    if ( pConfig ) assert( *pConfig == 0 );
    for ( i = 0; i < nIterMax; i++ )
    {
        // get variable assignment
        for ( v = 0; v < p->nObjs; v++ )
            p->Values[v] = v < p->nVars ? (iMint >> v) & 1 :  -1;
        p->Values[p->nObjs-1] = Abc_TtGetBit( pTruth, iMint );
        // derive clauses
        if ( !Ifn_NtkAddClauses( p, p->Values, pSat ) )
            break;
        // find assignment of parameters
//        clk2 = Abc_Clock();
        status = sat_solver_solve( pSat, NULL, NULL, nConfls, 0, 0, 0 );
//        clkSat += Abc_Clock() - clk2;
        if ( fVeryVerbose )
            Ifn_NtkMatchPrintStatus( pSat, i+1, status, iMint, p->Values[p->nObjs-1], Abc_Clock() - clk );
        if ( status != l_True )
            break;
        // collect assignment
        for ( v = p->nObjs; v < p->nPars; v++ )
            p->Values[v] = sat_solver_var_value(pSat, v);
        // find truth table
//        clk2 = Abc_Clock();
        pTruth1 = Ifn_NtkDeriveTruth( p, p->Values );
//        clkTru += Abc_Clock() - clk2;
        Abc_TtXor( pTruth1, pTruth1, p->pTruth, p->nWords, 0 );
        // find mismatch if present
        iMint = Abc_TtFindFirstBit( pTruth1, p->nVars );
        if ( iMint == -1 )
        {
            if ( pConfig ) 
                Ifn_NtkMatchCollectConfig( p, pSat, pConfig );
/*
            if ( pPerm )
            {
                int RetValue = Ifn_ManSatFindCofigBitsTest( p, pTruth, nVars, *pPerm );
                Ifn_NtkMatchPrintPerm( *pPerm, p->nInps );
                if ( RetValue == 0 )
                    printf( "Verification failed.\n" );
            }
*/
            RetValue = 1;
            break;
        }
    }
    assert( i < nIterMax );
    if ( fVerbose )
    {
        printf( "%s  Iter =%4d. Confl = %6d.  ", RetValue ? "yes":"no ", i, sat_solver_nconflicts(pSat) );
        if ( RetValue )
            Ifn_NtkMatchPrintConfig( p, pSat );
        printf( "\n" );
    }
    sat_solver_delete( pSat );
//    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
//    Abc_PrintTime( 1, "Sat", clkSat );
//    Abc_PrintTime( 1, "Tru", clkTru );
    return RetValue;
}